

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateFillStaticLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string err;
  FillStaticLayerParams *params;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,0,0);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      Result::~Result(__return_storage_ptr__);
      err.field_2._8_8_ = Specification::NeuralNetworkLayer::fillstatic(layer);
      iVar2 = Specification::FillStaticLayerParams::targetshape_size
                        ((FillStaticLayerParams *)err.field_2._8_8_);
      if (iVar2 == 0) {
        __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::operator+(&local_88,"Target shape is required parameter for \'",__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_88,"\' layer.");
        std::__cxx11::string::~string((string *)&local_88);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      else {
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateFillStaticLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 0));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.fillstatic();
    if (params.targetshape_size() == 0) {
        const std::string err = "Target shape is required parameter for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}